

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O2

bool __thiscall
booster::aio::event_loop_impl::io_event_canceler::cancelation_is_needed_with_data_mutex_locked
          (io_event_canceler *this)

{
  event_loop_impl *peVar1;
  io_data *piVar2;
  
  peVar1 = this->self_;
  if ((peVar1->dispatch_queue_).
      super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (peVar1->dispatch_queue_).
      super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    return true;
  }
  piVar2 = socket_map<booster::aio::event_loop_impl::io_data>::operator[](&peVar1->map_,this->fd);
  return (piVar2->writeable).call_ptr.p_ != (callable<void_(const_std::error_code_&)> *)0x0 ||
         ((piVar2->readable).call_ptr.p_ != (callable<void_(const_std::error_code_&)> *)0x0 ||
         piVar2->current_event != 0);
}

Assistant:

bool cancelation_is_needed_with_data_mutex_locked()
		{
			if(!self_->dispatch_queue_.empty())
				return true;
			io_data &cont=self_->map_[fd];
			if(cont.current_event == 0 && !cont.readable && !cont.writeable) {
				self_->map_.erase(fd);
				return false;
			}
			return true;
		}